

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

int lws_state_transition(lws_state_manager_t *mgr,int target)

{
  if (mgr->state != target) {
    _lws_state_transition(mgr,target);
  }
  return 0;
}

Assistant:

static int
_lws_state_transition(lws_state_manager_t *mgr, int target)
{
#if (_LWS_ENABLED_LOGS & LLL_DEBUG)
	char temp8[8];
#endif

	if (_report(mgr, mgr->state, target))
		return 1;

#if (_LWS_ENABLED_LOGS & LLL_DEBUG)
	if (mgr->context)
	lwsl_cx_debug(mgr->context, "%s: changed %d '%s' -> %d '%s'", mgr->name,
		   mgr->state, _systnm(mgr, mgr->state, temp8), target,
		   _systnm(mgr, target, temp8));
#endif

	mgr->state = target;

	/* Indicate success by calling the notifers again with both args same */
	_report(mgr, target, target);

#if defined(LWS_WITH_SYS_SMD)
	if (mgr->smd_class && mgr->context)
		(void)lws_smd_msg_printf(mgr->context,
				   mgr->smd_class, "{\"state\":\"%s\"}",
				   mgr->state_names[target]);
#endif

	return 0;
}